

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O2

unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
 __thiscall
JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::operator->
          (JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8> *this)

{
  __atomic_flag_data_type _Var1;
  _Head_base<0UL,_Enterprise::Dave::TimedInterruptSource_*,_false> extraout_RDX;
  JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8> *in_RSI;
  unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
  uVar2;
  
  LOCK();
  _Var1 = (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i;
  (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 == false) {
    flush(in_RSI);
    LOCK();
    (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i = false;
    UNLOCK();
    (this->super_Observer)._vptr_Observer = (_func_int **)in_RSI;
    (this->object_).global_divider_.super_WrappedInt<Cycles>.length_ = (IntType)&in_RSI->object_;
    uVar2._M_t.
    super___uniq_ptr_impl<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Enterprise::Dave::TimedInterruptSource_*,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    .super__Head_base<0UL,_Enterprise::Dave::TimedInterruptSource_*,_false>._M_head_impl =
         extraout_RDX._M_head_impl;
    uVar2._M_t.
    super___uniq_ptr_impl<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Enterprise::Dave::TimedInterruptSource_*,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    .
    super__Tuple_impl<1UL,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    .
    super__Head_base<1UL,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter,_false>
    ._M_head_impl.actor_ =
         (_Head_base<1UL,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter,_false>
          )(_Head_base<1UL,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter,_false>
            )this;
    return (unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
            )uVar2._M_t.
             super___uniq_ptr_impl<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
             ._M_t.
             super__Tuple_impl<0UL,_Enterprise::Dave::TimedInterruptSource_*,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    ;
  }
  __assert_fail("!flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/../../ClockReceiver/JustInTime.hpp"
                ,0x7e,
                "auto JustInTimeActor<Enterprise::Dave::TimedInterruptSource, HalfCycles, 1, 8>::operator->() [T = Enterprise::Dave::TimedInterruptSource, LocalTimeScale = HalfCycles, multiplier = 1, divider = 8]"
               );
}

Assistant:

[[nodiscard]] forceinline auto operator->() {
#ifndef NDEBUG
			assert(!flush_concurrency_check_.test_and_set());
#endif
			flush();
#ifndef NDEBUG
			flush_concurrency_check_.clear();
#endif
			return std::unique_ptr<T, SequencePointAwareDeleter>(&object_, SequencePointAwareDeleter(this));
		}